

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  long in_RSI;
  offset_in_RepeatedPtrFieldBase_to_subr in_stack_ffffffffffffffb8;
  RepeatedPtrFieldBase *in_stack_ffffffffffffffc8;
  RepeatedPtrFieldBase *in_stack_ffffffffffffffd0;
  
  if (*(int *)(in_RSI + 8) != 0) {
    MergeFromInternal(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffb8)
    ;
  }
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::MergeFrom(const RepeatedPtrFieldBase& other) {
  GOOGLE_DCHECK_NE(&other, this);
  if (other.current_size_ == 0) return;
  MergeFromInternal(other,
                    &RepeatedPtrFieldBase::MergeFromInnerLoop<TypeHandler>);
}